

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

MSize lj_tab_len(GCtab *t)

{
  cTValue *pcVar1;
  uint uVar2;
  MSize MVar3;
  ulong uVar4;
  MSize key;
  uint uVar5;
  uint uVar6;
  
  uVar5 = t->asize;
  if ((uVar5 < 2) ||
     (uVar4 = (ulong)(t->array).ptr32, *(int *)(uVar4 + 4 + (ulong)(uVar5 - 1) * 8) != -1)) {
    uVar4 = (ulong)(uVar5 - 1);
    if (uVar5 == 0) {
      uVar4 = 0;
    }
    MVar3 = (MSize)uVar4;
    if (t->hmask != 0) {
      uVar6 = MVar3 + 1;
      do {
        if (uVar6 < uVar5) {
          pcVar1 = (cTValue *)((ulong)(t->array).ptr32 + (long)(int)uVar6 * 8);
        }
        else {
          pcVar1 = lj_tab_getinth(t,uVar6);
        }
        if ((pcVar1 == (cTValue *)0x0) || ((pcVar1->field_2).it == 0xffffffff)) {
          do {
            MVar3 = (MSize)uVar4;
            uVar4 = (ulong)uVar6;
            do {
              uVar6 = (uint)uVar4;
              if (uVar6 - MVar3 < 2) {
                return MVar3;
              }
              uVar2 = uVar6 + MVar3 >> 1;
              uVar4 = (ulong)uVar2;
              if (uVar2 < uVar5) {
                pcVar1 = (cTValue *)((ulong)(t->array).ptr32 + uVar4 * 8);
              }
              else {
                pcVar1 = lj_tab_getinth(t,uVar2);
              }
            } while ((pcVar1 == (cTValue *)0x0) || ((pcVar1->field_2).it == 0xffffffff));
          } while( true );
        }
        uVar4 = (ulong)uVar6;
        uVar6 = uVar6 * 2;
      } while (uVar6 < 0x7ffffffe);
      key = 0;
      do {
        MVar3 = key;
        key = MVar3 + 1;
        if (key < uVar5) {
          pcVar1 = (cTValue *)((ulong)(t->array).ptr32 + (long)(int)key * 8);
        }
        else {
          pcVar1 = lj_tab_getinth(t,key);
        }
      } while ((pcVar1 != (cTValue *)0x0) && ((pcVar1->field_2).it != 0xffffffff));
    }
  }
  else {
    uVar6 = 1;
    while (uVar2 = uVar6, 1 < uVar5 - uVar2) {
      uVar6 = uVar2 + uVar5 >> 1;
      if (*(int *)(uVar4 + 4 + (ulong)(uVar6 - 1) * 8) == -1) {
        uVar5 = uVar6;
        uVar6 = uVar2;
      }
    }
    MVar3 = uVar2 - 1;
  }
  return MVar3;
}

Assistant:

MSize LJ_FASTCALL lj_tab_len(GCtab *t)
{
  MSize j = (MSize)t->asize;
  if (j > 1 && tvisnil(arrayslot(t, j-1))) {
    MSize i = 1;
    while (j - i > 1) {
      MSize m = (i+j)/2;
      if (tvisnil(arrayslot(t, m-1))) j = m; else i = m;
    }
    return i-1;
  }
  if (j) j--;
  if (t->hmask <= 0)
    return j;
  return unbound_search(t, j);
}